

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

int __thiscall MutableS2ShapeIndex::GetEdgeMaxLevel(MutableS2ShapeIndex *this,Edge *edge)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = (edge->v0).c_[0] - (edge->v1).c_[0];
  dVar4 = (edge->v0).c_[1] - (edge->v1).c_[1];
  dVar2 = (edge->v0).c_[2] - (edge->v1).c_[2];
  dVar2 = dVar2 * dVar2 + dVar4 * dVar4 + dVar3 * dVar3;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  iVar1 = S2::Metric<1>::GetLevelForMaxValue
                    ((Metric<1> *)&S2::kAvgEdge,
                     dVar2 * FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
  return iVar1;
}

Assistant:

int MutableS2ShapeIndex::GetEdgeMaxLevel(const S2Shape::Edge& edge) const {
  // Compute the maximum cell size for which this edge is considered "long".
  // The calculation does not need to be perfectly accurate, so we use Norm()
  // rather than Angle() for speed.
  double cell_size = ((edge.v0 - edge.v1).Norm() *
                      FLAGS_s2shape_index_cell_size_to_long_edge_ratio);
  // Now return the first level encountered during subdivision where the
  // average cell size is at most "cell_size".
  return S2::kAvgEdge.GetLevelForMaxValue(cell_size);
}